

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void mpt_copy_fd(int pts,float *src,int lds,double *dest,int ldd)

{
  float fVar1;
  ulong uVar2;
  
  if (0 < pts) {
    if (ldd == 0) {
      *dest = (double)src[(pts + -1) * lds];
      return;
    }
    if (lds == 0) {
      fVar1 = *src;
      uVar2 = 0;
      do {
        dest[uVar2] = (double)fVar1;
        uVar2 = uVar2 + 1;
      } while ((uint)pts != uVar2);
    }
    else if (ldd == 1 && lds == 1) {
      uVar2 = 0;
      do {
        dest[uVar2] = (double)src[uVar2];
        uVar2 = uVar2 + 1;
      } while ((uint)pts != uVar2);
    }
    else {
      do {
        *dest = (double)*src;
        dest = dest + ldd;
        src = src + lds;
        pts = pts + -1;
      } while (pts != 0);
    }
  }
  return;
}

Assistant:

extern void MPT_COPY_FCN(int pts, const MPT_COPY_ST *src, int lds, MPT_COPY_DT *dest, int ldd)
{
	int i, j;
	
	if (pts <= 0) {
		return;
	}
	if (!ldd) {
		dest[0] = src[(pts - 1) * lds];
		return;
	}
	if (!lds) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[0];
		}
		return;
	}
	if (lds == 1 && ldd == 1) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[i];
		}
		return;
	}
	for (i = 0, j = 0; pts--; i += ldd, j += lds) {
		dest[i] = src[j];
	}
}